

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O1

bool __thiscall QAbstractScrollArea::eventFilter(QAbstractScrollArea *this,QObject *o,QEvent *e)

{
  long lVar1;
  undefined1 uVar2;
  int iVar3;
  QStyle *pQVar4;
  QWidget *this_00;
  QScrollBar *sbar;
  
  lVar1 = *(long *)(this + 8);
  this_00 = *(QWidget **)(lVar1 + 0x288);
  if ((((this_00 == (QWidget *)o) || (*(QObject **)(lVar1 + 0x290) == o)) &&
      (*(ushort *)(e + 8) - 0x7f < 2)) &&
     ((*(int *)(lVar1 + 0x29c) == 0 && (*(int *)(lVar1 + 0x298) == 0)))) {
    if (this_00 == (QWidget *)o) {
      this_00 = *(QWidget **)(lVar1 + 0x290);
    }
    pQVar4 = QWidget::style((QWidget *)o);
    iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x60,0,o,0);
    if (iVar3 != 0) {
      pQVar4 = QWidget::style(this_00);
      iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x60,0,this_00,0);
      if (iVar3 != 0) {
        QScrollBarPrivate::setTransient
                  (*(QScrollBarPrivate **)&this_00->field_0x8,*(short *)(e + 8) == 0x80);
      }
    }
  }
  uVar2 = QObject::eventFilter((QObject *)this,(QEvent *)o);
  return (bool)uVar2;
}

Assistant:

bool QAbstractScrollArea::eventFilter(QObject *o, QEvent *e)
{
    Q_D(QAbstractScrollArea);
    if ((o == d->hbar || o == d->vbar) && (e->type() == QEvent::HoverEnter || e->type() == QEvent::HoverLeave)) {
        if (d->hbarpolicy == Qt::ScrollBarAsNeeded && d->vbarpolicy == Qt::ScrollBarAsNeeded) {
            QScrollBar *sbar = static_cast<QScrollBar*>(o);
            QScrollBar *sibling = sbar == d->hbar ? d->vbar : d->hbar;
            if (sbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, nullptr, sbar) &&
                    sibling->style()->styleHint(QStyle::SH_ScrollBar_Transient, nullptr, sibling))
                d->setScrollBarTransient(sibling, e->type() == QEvent::HoverLeave);
        }
    }
    return QFrame::eventFilter(o, e);
}